

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Image::writePNG((Image *)CONCAT44(in_register_00000034,__fd),(path *)__buf,&local_38);
  sVar1 = std::__cxx11::string::~string((string *)&local_38);
  return sVar1;
}

Assistant:

virtual void write(Image& img, fs::path path) {
		img.writePNG(path);
	}